

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

int clickhouse::SocketConnect
              (NetworkAddress *addr,optional<clickhouse::SocketTimeoutParams> *socket_timeout_params
              )

{
  int fd_00;
  int iVar1;
  int *piVar2;
  system_error *psVar3;
  error_category *peVar4;
  int iVar5;
  addrinfo *paVar6;
  int err;
  socklen_t len;
  pollfd fd;
  int local_60 [2];
  pollfd local_58;
  __suseconds_t _Stack_50;
  __time_t local_48;
  __suseconds_t _Stack_40;
  
  paVar6 = addr->info_;
  if (paVar6 != (addrinfo *)0x0) {
    iVar5 = 0;
    do {
      fd_00 = socket(paVar6->ai_family,paVar6->ai_socktype,paVar6->ai_protocol);
      if (fd_00 != -1) {
        anon_unknown_4::SetNonBlock(fd_00,true);
        if ((socket_timeout_params->
            super__Optional_base<clickhouse::SocketTimeoutParams,_true,_true>)._M_payload.
            super__Optional_payload_base<clickhouse::SocketTimeoutParams>._M_engaged == true) {
          local_58 = (pollfd)(socket_timeout_params->
                             super__Optional_base<clickhouse::SocketTimeoutParams,_true,_true>).
                             _M_payload.
                             super__Optional_payload_base<clickhouse::SocketTimeoutParams>.
                             _M_payload._M_value.recv_timeout_.tv_sec;
          _Stack_50 = (socket_timeout_params->
                      super__Optional_base<clickhouse::SocketTimeoutParams,_true,_true>)._M_payload.
                      super__Optional_payload_base<clickhouse::SocketTimeoutParams>._M_payload.
                      _M_value.recv_timeout_.tv_usec;
          local_48 = (socket_timeout_params->
                     super__Optional_base<clickhouse::SocketTimeoutParams,_true,_true>)._M_payload.
                     super__Optional_payload_base<clickhouse::SocketTimeoutParams>._M_payload.
                     _M_value.send_timeout_.tv_sec;
          _Stack_40 = (socket_timeout_params->
                      super__Optional_base<clickhouse::SocketTimeoutParams,_true,_true>)._M_payload.
                      super__Optional_payload_base<clickhouse::SocketTimeoutParams>._M_payload.
                      _M_value.send_timeout_.tv_usec;
          iVar1 = setsockopt(fd_00,1,0x14,&local_58,0x10);
          if (iVar1 < 0) {
            psVar3 = (system_error *)__cxa_allocate_exception(0x20);
            piVar2 = __errno_location();
            iVar5 = *piVar2;
            peVar4 = (error_category *)std::_V2::system_category();
            std::system_error::system_error(psVar3,iVar5,peVar4,"failed to setsockopt(SO_RCVTIMEO)")
            ;
            goto LAB_001371b7;
          }
          iVar1 = setsockopt(fd_00,1,0x15,&local_48,0x10);
          if (iVar1 < 0) {
            psVar3 = (system_error *)__cxa_allocate_exception(0x20);
            piVar2 = __errno_location();
            iVar5 = *piVar2;
            peVar4 = (error_category *)std::_V2::system_category();
            std::system_error::system_error(psVar3,iVar5,peVar4,"failed to setsockopt(SO_SNDTIMEO)")
            ;
            goto LAB_001371b7;
          }
        }
        iVar1 = connect(fd_00,(sockaddr *)paVar6->ai_addr,paVar6->ai_addrlen);
        if (iVar1 == 0) {
LAB_001370e2:
          anon_unknown_4::SetNonBlock(fd_00,false);
          return fd_00;
        }
        piVar2 = __errno_location();
        local_60[0] = *piVar2;
        if ((local_60[0] == 0x73) || (local_60[0] == 0xb)) {
          local_58.events = 4;
          local_58.revents = 0;
          local_58.fd = fd_00;
          iVar1 = poll(&local_58,1,5000);
          if (iVar1 == -1) {
            psVar3 = (system_error *)__cxa_allocate_exception(0x20);
            iVar5 = *piVar2;
            peVar4 = (error_category *)std::_V2::system_category();
            std::system_error::system_error(psVar3,iVar5,peVar4,"fail to connect");
            goto LAB_001371b7;
          }
          if (0 < iVar1) {
            local_60[1] = 4;
            getsockopt(fd_00,1,4,local_60,(socklen_t *)(local_60 + 1));
            iVar5 = local_60[0];
            if (local_60[0] == 0) goto LAB_001370e2;
          }
        }
      }
      paVar6 = paVar6->ai_next;
    } while (paVar6 != (addrinfo *)0x0);
    if (0 < iVar5) {
      psVar3 = (system_error *)__cxa_allocate_exception(0x20);
      peVar4 = (error_category *)std::_V2::system_category();
      std::system_error::system_error(psVar3,iVar5,peVar4,"fail to connect");
      __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
    }
  }
  psVar3 = (system_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  iVar5 = *piVar2;
  peVar4 = (error_category *)std::_V2::system_category();
  std::system_error::system_error(psVar3,iVar5,peVar4,"fail to connect");
LAB_001371b7:
  __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

SOCKET SocketConnect(const NetworkAddress& addr, const std::optional<SocketTimeoutParams>& socket_timeout_params) {
    int last_err = 0;
    for (auto res = addr.Info(); res != nullptr; res = res->ai_next) {
        SOCKET s(socket(res->ai_family, res->ai_socktype, res->ai_protocol));

        if (s == -1) {
            continue;
        }

        SetNonBlock(s, true);
        if(socket_timeout_params) {
            SetTimeout(s, *socket_timeout_params);
        }

        if (connect(s, res->ai_addr, (int)res->ai_addrlen) != 0) {
            int err = errno;
            if (err == EINPROGRESS || err == EAGAIN || err == EWOULDBLOCK) {
                pollfd fd;
                fd.fd = s;
                fd.events = POLLOUT;
                fd.revents = 0;
                ssize_t rval = Poll(&fd, 1, 5000);

                if (rval == -1) {
                    throw std::system_error(errno, std::system_category(), "fail to connect");
                }
                if (rval > 0) {
                    socklen_t len = sizeof(err);
                    getsockopt(s, SOL_SOCKET, SO_ERROR, (char*)&err, &len);

                    if (!err) {
                        SetNonBlock(s, false);
                        return s;
                    }
                   last_err = err;
                }
            }
        } else {
            SetNonBlock(s, false);
            return s;
        }
    }
    if (last_err > 0) {
        throw std::system_error(last_err, std::system_category(), "fail to connect");
    }
    throw std::system_error(
        errno, std::system_category(), "fail to connect"
    );
}